

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O0

void duckdb::PhysicalJoin::ConstructAntiJoinResult
               (DataChunk *left,DataChunk *result,bool *found_match)

{
  bool *in_stack_00000020;
  DataChunk *in_stack_00000028;
  DataChunk *in_stack_00000030;
  
  ConstructSemiOrAntiJoinResult<false>(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  return;
}

Assistant:

void PhysicalJoin::ConstructAntiJoinResult(DataChunk &left, DataChunk &result, bool found_match[]) {
	ConstructSemiOrAntiJoinResult<false>(left, result, found_match);
}